

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O2

void __thiscall FactorisedJoin::sortDataToProcess(FactorisedJoin *this)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  DTree *this_00;
  pointer piVar3;
  undefined1 auVar4 [16];
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  DTreeNode *pDVar9;
  size_t j;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  size_type sVar12;
  size_t table;
  unsigned_long *puVar13;
  long *plVar14;
  _Iter_comp_iter<FactorisedJoin::ValueOrdering> __comp;
  int index;
  undefined4 uStack_ac;
  vector<long,_std::allocator<long>_> priority;
  unsigned_long local_88;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  treeAttributeIDs;
  string local_50;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&treeAttributeIDs,dfdb::params::NUM_OF_TABLES,(allocator_type *)&priority);
  uVar10 = 0;
  do {
    sVar12 = dfdb::params::NUM_OF_TABLES;
    if (dfdb::params::NUM_OF_TABLES <= uVar10) {
      uVar10 = CONCAT44(uRam00000000001533f4,dfdb::params::NUM_OF_ATTRIBUTES);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar10;
      uVar6 = SUB168(auVar4 * ZEXT816(0x18),0);
      uVar11 = uVar6 + 8;
      if (0xfffffffffffffff7 < uVar6) {
        uVar11 = 0xffffffffffffffff;
      }
      if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
        uVar11 = 0xffffffffffffffff;
      }
      puVar7 = (ulong *)operator_new__(uVar11);
      *puVar7 = uVar10;
      if (uVar10 != 0) {
        memset((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(puVar7 + 1),0,
               ((uVar6 - 0x18) - (uVar6 - 0x18) % 0x18) + 0x18);
      }
      this->_ids = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   (puVar7 + 1);
      uVar11 = 0;
      do {
        if (uVar10 <= uVar11) {
          priority.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          priority.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          priority.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          uVar10 = 0;
          do {
            if (sVar12 <= uVar10) {
              std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                        (&priority.super__Vector_base<long,_std::allocator<long>_>);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::~vector(&treeAttributeIDs);
              return;
            }
            if (priority.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                priority.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start) {
              priority.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   priority.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            pDVar9 = DTree::getNode((this->_dTree).
                                    super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                    dfdb::params::NUM_OF_ATTRIBUTES + (int)uVar10);
            for (pDVar9 = pDVar9->_parent; pDVar9 != (DTreeNode *)0x0; pDVar9 = pDVar9->_parent) {
              piVar3 = treeAttributeIDs.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar10].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              for (lVar8 = 0;
                  (long)treeAttributeIDs.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar3 >> 2 != lVar8;
                  lVar8 = lVar8 + 1) {
                if (pDVar9->_id == piVar3[lVar8]) {
                  _index = lVar8;
                  std::vector<long,_std::allocator<long>_>::push_back
                            (&priority,(value_type_conflict4 *)&index);
                  break;
                }
              }
            }
            __comp._M_comp.priorityMaxIndex =
                 ((long)priority.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)priority.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) - 1;
            __comp._M_comp.priority =
                 priority.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            std::
            __sort<__gnu_cxx::__normal_iterator<double**,std::vector<double*,std::allocator<double*>>>,__gnu_cxx::__ops::_Iter_comp_iter<FactorisedJoin::ValueOrdering>>
                      ((__normal_iterator<double_**,_std::vector<double_*,_std::allocator<double_*>_>_>
                        )this->_data[uVar10].super__Vector_base<double_*,_std::allocator<double_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<double_**,_std::vector<double_*,_std::allocator<double_*>_>_>
                        )this->_data[uVar10].super__Vector_base<double_*,_std::allocator<double_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__comp);
            uVar10 = uVar10 + 1;
            sVar12 = dfdb::params::NUM_OF_TABLES;
          } while( true );
        }
        for (uVar10 = 0; uVar10 < sVar12; uVar10 = uVar10 + 1) {
          piVar3 = treeAttributeIDs.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          for (lVar8 = 0;
              (long)treeAttributeIDs.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar10].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish - (long)piVar3 >> 2 != lVar8; lVar8 = lVar8 + 1) {
            if (piVar3[lVar8] == (int)uVar11) {
              priority.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)CONCAT44((int)lVar8,(int)uVar10);
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                         (this->_ids + uVar11),(pair<int,_int> *)&priority);
              sVar12 = dfdb::params::NUM_OF_TABLES;
              break;
            }
          }
        }
        uVar11 = uVar11 + 1;
        uVar10 = CONCAT44(uRam00000000001533f4,dfdb::params::NUM_OF_ATTRIBUTES);
      } while( true );
    }
    iVar5 = (*((this->_dataHandler).super___shared_ptr<DataHandler,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_DataHandler[5])();
    puVar1 = *(unsigned_long **)(CONCAT44(extraout_var,iVar5) + 8 + uVar10 * 0x18);
    for (puVar13 = *(unsigned_long **)(CONCAT44(extraout_var,iVar5) + uVar10 * 0x18);
        puVar13 != puVar1; puVar13 = puVar13 + 1) {
      uVar2 = *puVar13;
      iVar5 = (*((this->_dataHandler).super___shared_ptr<DataHandler,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_DataHandler[9])();
      plVar14 = (long *)(CONCAT44(extraout_var_00,iVar5) + 0x10);
      while (plVar14 = (long *)*plVar14, plVar14 != (long *)0x0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)&priority,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)(plVar14 + 1));
        if (local_88 == uVar2) {
          this_00 = (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__cxx11::string::string((string *)&local_50,(string *)&priority);
          iVar5 = DTree::getIndexByName(this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          _index = CONCAT44(uStack_ac,iVar5);
          std::vector<int,_std::allocator<int>_>::push_back
                    (treeAttributeIDs.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar10,&index);
          std::__cxx11::string::~string((string *)&priority);
          break;
        }
        std::__cxx11::string::~string((string *)&priority);
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void FactorisedJoin::sortDataToProcess()
{
    /* Contains an ID for each node in the DTree and for each table. */
    vector<vector<int> > treeAttributeIDs(NUM_OF_TABLES);

    /* Iterate through all tables. */
    for (size_t table = 0; table < NUM_OF_TABLES; ++table)
    {
        /* Iterate through all the table attribute IDs of the current table. */
        for (uint_fast16_t id : _dataHandler->getTableAttributes()[table])
        {
            /* Scan through the (string, ID) mapping to find the attribute name of the current attribute ID. */
            for (auto pair : _dataHandler->getNamesMapping())
            {
                if (pair.second == id)
                {
                    /* Retrieve DTree ID with attribute name. */
                    auto index = _dTree->getIndexByName(pair.first);

                    treeAttributeIDs[table].push_back(
                        index);
                    break;
                }
            }
        }
    }

    /*
     * The ids vectors will contain the pairs of INDEXES in the array attributes-attr.
     * For each attribute KEY-index we append the pairs of indexes having that key,
     * so we will have all the pairs of <relationIndex-attributeIndex> for each attribute KEY.
     */
    _ids = new vector<pair<int, int> > [NUM_OF_ATTRIBUTES];
    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
    {
        for (size_t j = 0; j < NUM_OF_TABLES; ++j)
        {
            for (size_t k = 0; k < treeAttributeIDs[j].size(); ++k)
                if (treeAttributeIDs[j][k] == (int) i)
                {
                    _ids[i].push_back(make_pair(j, k));
                    break;
                }
        }
    }

    vector<int_fast16_t> priority;
    for (size_t table = 0; table < NUM_OF_TABLES; ++table)
    {
        priority.clear();

        DTreeNode* node = _dTree->getNode(table + NUM_OF_ATTRIBUTES)->_parent;

        while (node != NULL)
        {
            int_fast16_t pos = -1;
            for (size_t j = 0; j < treeAttributeIDs[table].size(); ++j)
                if (node->_id == treeAttributeIDs[table][j])
                {
                    pos = j;
                    break;
                }
            if (pos != -1)
                priority.push_back(pos);
            node = node->_parent;
        }

        /* Launch sorting; depending on the compiler, this will or will not be done in parallel. */
        sortingAlgorithm(_data[table].begin(), _data[table].end(),
                         ValueOrdering(priority.data(), priority.size()));
    }

    DINFO("WORKER - engine: finished sorting data to process.\n");
}